

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Own<const_kj::FsNode,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskReadableDirectory::cloneFsNode(DiskReadableDirectory *this)

{
  undefined8 *puVar1;
  int in_ECX;
  void *in_RDX;
  FsNode *extraout_RDX;
  long in_RSI;
  void *in_R8;
  Own<const_kj::FsNode,_std::nullptr_t> OVar2;
  DiskHandle local_c;
  
  DiskHandle::clone(&local_c,(__fn *)(in_RSI + 8),in_RDX,in_ECX,in_R8);
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = &PTR_getFd_00710d20;
  ((OwnFd *)(puVar1 + 1))->fd = (int)local_c.fd.fd;
  local_c.fd.fd = (OwnFd)-1;
  *puVar1 = &PTR_getFd_007106e0;
  (this->super_ReadableDirectory).super_FsNode._vptr_FsNode =
       (_func_int **)
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskReadableDirectory>::instance;
  *(undefined8 **)&this->super_DiskHandle = puVar1;
  OwnFd::~OwnFd(&local_c.fd);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Array<Entry> listEntries() const override { return DiskHandle::listEntries(); }